

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O3

void Bac_ManUndoGates(Bac_Man_t *p)

{
  void *__ptr;
  int iVar1;
  long lVar2;
  
  if (p->pMioLib != (void *)0x0) {
    iVar1 = Abc_NamObjNumMax(p->pMods);
    if (1 < iVar1) {
      lVar2 = 1;
      do {
        __ptr = p->ppGraphs[lVar2];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 0x10) != (void *)0x0) {
            free(*(void **)((long)__ptr + 0x10));
          }
          free(__ptr);
        }
        lVar2 = lVar2 + 1;
        iVar1 = Abc_NamObjNumMax(p->pMods);
      } while (lVar2 < iVar1);
    }
    if (p->ppGraphs != (void **)0x0) {
      free(p->ppGraphs);
      p->ppGraphs = (void **)0x0;
    }
  }
  return;
}

Assistant:

void Bac_ManUndoGates( Bac_Man_t * p )
{
    int i;
    if ( p->pMioLib == NULL )
        return;
    for ( i = 1; i < Abc_NamObjNumMax(p->pMods); i++ )
        if ( p->ppGraphs[i] )
            Dec_GraphFree( (Dec_Graph_t *)p->ppGraphs[i] );
    ABC_FREE( p->ppGraphs );
}